

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall Assimp::Ogre::Bone::AddChild(Bone *this,Bone *bone)

{
  bool bVar1;
  DeadlyImportError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Bone *local_18;
  Bone *bone_local;
  Bone *this_local;
  
  if (bone != (Bone *)0x0) {
    local_18 = bone;
    bone_local = this;
    bVar1 = IsParented(bone);
    if (bVar1) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_38,"Attaching child Bone that is already parented: ",&local_18->name);
      DeadlyImportError::DeadlyImportError(this_00,&local_38);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    local_18->parent = this;
    local_18->parentId = (uint)this->id;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->children,&local_18->id);
  }
  return;
}

Assistant:

void Bone::AddChild(Bone *bone)
{
    if (!bone)
        return;
    if (bone->IsParented())
        throw DeadlyImportError("Attaching child Bone that is already parented: " + bone->name);

    bone->parent = this;
    bone->parentId = id;
    children.push_back(bone->id);
}